

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O2

NodeFS * __thiscall NodeFS::InsertNode(NodeFS *this,string *node_name)

{
  __type _Var1;
  NodeFS *this_00;
  pointer ppNVar2;
  NodeFS *new_node;
  
  for (ppNVar2 = (this->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppNVar2 !=
      (this->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppNVar2 = ppNVar2 + 1) {
    _Var1 = std::operator==(&(*ppNVar2)->name_,node_name);
    if (_Var1) goto LAB_0013d9d8;
  }
  this_00 = (NodeFS *)operator_new(0x68);
  NodeFS(this_00);
  new_node = this_00;
  std::__cxx11::string::_M_assign((string *)&this_00->name_);
  this_00->is_leaf_ = false;
  std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>::push_back(&this->sub_node_,&new_node);
  ppNVar2 = &new_node;
LAB_0013d9d8:
  return *ppNVar2;
}

Assistant:

NodeFS* NodeFS::InsertNode(std::string node_name)
{
   // Look for node : Already exists ?
   for (std::vector<NodeFS*>::iterator it = sub_node_.begin(); it != sub_node_.end(); ++it)
   {
      if ((*it)->name_ == node_name)
         return *it;
   }
   // It does not exists
   NodeFS* new_node = new NodeFS;
   new_node->name_ = node_name;
   new_node->is_leaf_ = false;
   sub_node_.push_back(new_node);

   return new_node;
}